

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakMap.cpp
# Opt level: O0

Var Js::JavascriptWeakMap::EntryDelete(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *pTVar5;
  Var *values;
  undefined4 *puVar6;
  Var pvVar7;
  JavascriptWeakMap *this;
  RecyclableObject *key_00;
  ScriptContext *pSVar8;
  JavascriptLibrary *pJVar9;
  JavascriptBoolean *pJVar10;
  RecyclableObject *local_80;
  RecyclableObject *keyObj;
  bool didDelete;
  Var key;
  JavascriptWeakMap *weakMap;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  pTVar5 = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar5,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptWeakMap.cpp"
                                ,0x93,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,0);
  bVar2 = VarIs<Js::JavascriptWeakMap>(pvVar7);
  if (bVar2) {
    pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,0);
    this = VarTo<Js::JavascriptWeakMap>(pvVar7);
    if (((uint)scriptContext & 0xffffff) == 1 || ((ulong)scriptContext & 0xffffff) == 0) {
      pJVar9 = ScriptContext::GetLibrary(pSVar4);
      local_80 = JavascriptLibraryBase::GetUndefined(&pJVar9->super_JavascriptLibraryBase);
    }
    else {
      local_80 = (RecyclableObject *)Arguments::operator[]((Arguments *)&scriptContext,1);
    }
    keyObj._7_1_ = false;
    BVar3 = Js::JavascriptOperators::IsObject(local_80);
    if (BVar3 != 0) {
      key_00 = VarTo<Js::RecyclableObject>(local_80);
      keyObj._7_1_ = Delete(this,key_00);
    }
    bVar2 = ScriptContext::IsTTDRecordOrReplayModeEnabled(pSVar4);
    if (bVar2) {
      bVar2 = ScriptContext::IsTTDRecordModeEnabled(pSVar4);
      if (bVar2) {
        pSVar8 = RecyclableObject::GetScriptContext(function);
        pTVar5 = ScriptContext::GetThreadContext(pSVar8);
        TTD::EventLog::RecordWeakCollectionContainsEvent(pTVar5->TTDLog,keyObj._7_1_);
      }
      else {
        pSVar8 = RecyclableObject::GetScriptContext(function);
        pTVar5 = ScriptContext::GetThreadContext(pSVar8);
        keyObj._7_1_ = TTD::EventLog::ReplayWeakCollectionContainsEvent(pTVar5->TTDLog);
      }
    }
    pJVar9 = ScriptContext::GetLibrary(pSVar4);
    pJVar10 = JavascriptLibrary::CreateBoolean(pJVar9,(uint)keyObj._7_1_);
    return pJVar10;
  }
  JavascriptError::ThrowTypeErrorVar(pSVar4,-0x7ff5ec04,L"WeakMap.prototype.delete",L"WeakMap");
}

Assistant:

Var JavascriptWeakMap::EntryDelete(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        if (!VarIs<JavascriptWeakMap>(args[0]))
        {
            JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("WeakMap.prototype.delete"), _u("WeakMap"));
        }

        JavascriptWeakMap* weakMap = VarTo<JavascriptWeakMap>(args[0]);

        Var key = (args.Info.Count > 1) ? args[1] : scriptContext->GetLibrary()->GetUndefined();
        bool didDelete = false;

        if (JavascriptOperators::IsObject(key))
        {
            RecyclableObject* keyObj = VarTo<RecyclableObject>(key);

            didDelete = weakMap->Delete(keyObj);
        }

#if ENABLE_TTD
        if(scriptContext->IsTTDRecordOrReplayModeEnabled())
        {
            if(scriptContext->IsTTDRecordModeEnabled())
            {
                function->GetScriptContext()->GetThreadContext()->TTDLog->RecordWeakCollectionContainsEvent(didDelete);
            }
            else
            {
                didDelete = function->GetScriptContext()->GetThreadContext()->TTDLog->ReplayWeakCollectionContainsEvent();
            }
        }
#endif

        return scriptContext->GetLibrary()->CreateBoolean(didDelete);
    }